

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O2

void doubleCos1D_eval<IMLE>(IMLE *imleObj)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double local_108;
  double local_100;
  Vec zTest;
  void *local_e8 [2];
  ArrayX x;
  Scalar local_70;
  RandomAccessLinSpacedReturnType local_68;
  
  x.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8[0] = (void *)0x0;
  x.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  x.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = 12.566370614359172;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
            (&local_68,100,(Scalar *)local_e8,&local_70);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&zTest,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_68);
  local_108 = 0.0;
  local_100 = 0.0;
  for (dVar4 = 0.0; dVar4 != 4.94065645841247e-322; dVar4 = (double)((long)dVar4 + 1)) {
    local_68.m_rows.m_value =
         (long)(zTest.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data + (long)dVar4);
    local_68.m_functor.impl.m_low = (double)&zTest;
    local_68.m_functor.impl.m_step =
         (double)zTest.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
    local_68.m_functor.impl.m_high = dVar4;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_e8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
               &local_68);
    IMLE::predictMultiple(imleObj,(Z *)local_e8);
    free(local_e8[0]);
    uVar1 = imleObj->nSolFound;
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator=(&x,&imleObj->predictions);
    dVar7 = cos(zTest.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[(long)dVar4]);
    std::operator<<((ostream *)&std::cout,"z = ");
    poVar2 = std::ostream::_M_insert<double>
                       (zTest.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data[(long)dVar4]);
    std::operator<<(poVar2," --> \tTargets: ");
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    std::operator<<(poVar2,"   ");
    poVar2 = std::ostream::_M_insert<double>(dVar7 + 4.0);
    std::operator<<(poVar2,"\n\t\t    Predictions: ");
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (lVar3 = 0; uVar5 * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
      poVar2 = std::ostream::_M_insert<double>
                         (**(double **)
                            ((long)&((x.
                                      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data + lVar3));
      std::operator<<(poVar2,"   ");
      dVar8 = **(double **)
                ((long)&((x.
                          super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                        m_data + lVar3);
      uVar6 = -(ulong)(dVar8 < dVar7 + 2.0);
      dVar8 = dVar8 - (double)(~uVar6 & (ulong)(dVar7 + 4.0) | uVar6 & (ulong)dVar7);
      local_100 = local_100 + dVar8 * dVar8;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_108 = local_108 + (double)(int)uVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\t --- doubleCos1D_eval: ---");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t\tNumber of experts created: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,imleObj->M);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"\t\tAverage number of predicted solutions: ");
  poVar2 = std::ostream::_M_insert<double>(local_108 / 100.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"\t\tRMSE: ");
  local_100 = local_100 / local_108;
  if (local_100 < 0.0) {
    local_100 = sqrt(local_100);
  }
  else {
    local_100 = SQRT(local_100);
  }
  poVar2 = std::ostream::_M_insert<double>(local_100);
  std::endl<char,std::char_traits<char>>(poVar2);
  free(zTest.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&x);
  return;
}

Assistant:

void doubleCos1D_eval( Learner &imleObj)
{
	const int nTest = 100;
    typename Learner::ArrayX x;
	Vec zTest = Vec::LinSpaced(100, 0.0, 4*M_PI);
	int nSol;
	Scal err;

	Scal sumSol = 0;
	Scal sumErrSqr = 0.0;

	for( int i = 0; i < nTest; i++)
	{
		imleObj.predictMultiple(zTest.row(i));

		nSol = imleObj.getNumberOfSolutionsFound();
		x = imleObj.getMultiplePredictions();

        Scal x1 = cos(zTest[i]);
        Scal x2 = x1 + 4.0;

        cout << "z = " << zTest[i] << " --> \tTargets: " << x1 << "   " << x2 << "\n\t\t    Predictions: ";
		for(int k = 0; k < nSol; k++)
		{
		    cout << x[k][0] << "   ";

			if( x[k][0] < x1 + 2.0 )	// Getting the closest true value to the IMLE estimate, and using it to calculate the error
				err = x[k][0] - x1;
			else
				err = x[k][0] - x2;

			sumErrSqr += err*err;
		}
		sumSol += nSol;
        cout << endl;
	}
	cout << "\t --- doubleCos1D_eval: ---" << endl;
	cout << "\t\tNumber of experts created: " << imleObj.getNumberOfExperts() << endl;
	cout << "\t\tAverage number of predicted solutions: " << sumSol/nTest << endl;
	cout << "\t\tRMSE: " << sqrt( sumErrSqr / sumSol ) << endl;
}